

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O3

void __thiscall GuiScope::paint(GuiScope *this)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  
  bVar1 = ImGui::Begin("Uniforms",(bool *)0x0,0);
  p_Var2 = (this->vars_)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0 && bVar1) {
    do {
      ImGui::DragScalarN((char *)p_Var2[1]._M_nxt,8,(void *)((long)&p_Var2[5]._M_nxt + 4),
                         *(int *)&p_Var2[5]._M_nxt,0.01,(void *)0x0,(void *)0x0,(char *)0x0,1.0);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  ImGui::End();
  return;
}

Assistant:

void GuiScope::paint() {
	if (ImGui::Begin("Uniforms")) {
		for(auto &[name, v]: vars_) {
			//MSG("%s -> %d", name.c_str(), v.components);
			//ImGui::LabelText("", "%s", name.c_str());
			ImGui::DragScalarN(name.c_str(), ImGuiDataType_Float, &v.value.x, v.components, .01f);
		}
	}

	ImGui::End();
}